

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsViewPrivate::updateScroll(QGraphicsViewPrivate *this)

{
  bool bVar1;
  int iVar2;
  QGraphicsView *this_00;
  QGraphicsViewPrivate *in_RDI;
  QGraphicsView *q;
  
  this_00 = q_func(in_RDI);
  in_RDI->scrollX = (long)-in_RDI->leftIndent;
  bVar1 = QWidget::isRightToLeft((QWidget *)0xa3298c);
  if (bVar1) {
    if ((in_RDI->leftIndent == 0.0) && (!NAN(in_RDI->leftIndent))) {
      iVar2 = QAbstractSlider::minimum((QAbstractSlider *)this_00);
      in_RDI->scrollX = (long)iVar2 + in_RDI->scrollX;
      iVar2 = QAbstractSlider::maximum((QAbstractSlider *)this_00);
      in_RDI->scrollX = (long)iVar2 + in_RDI->scrollX;
      iVar2 = QAbstractSlider::value((QAbstractSlider *)this_00);
      in_RDI->scrollX = in_RDI->scrollX - (long)iVar2;
    }
  }
  else {
    iVar2 = QAbstractSlider::value((QAbstractSlider *)this_00);
    in_RDI->scrollX = (long)iVar2 + in_RDI->scrollX;
  }
  iVar2 = QAbstractSlider::value((QAbstractSlider *)this_00);
  in_RDI->scrollY = (long)((double)iVar2 - in_RDI->topIndent);
  *(uint *)&in_RDI->field_0x300 = *(uint *)&in_RDI->field_0x300 & 0xffffffdf;
  return;
}

Assistant:

void QGraphicsViewPrivate::updateScroll()
{
    Q_Q(QGraphicsView);
    scrollX = qint64(-leftIndent);
    if (q->isRightToLeft()) {
        if (!leftIndent) {
            scrollX += hbar->minimum();
            scrollX += hbar->maximum();
            scrollX -= hbar->value();
        }
    } else {
        scrollX += hbar->value();
    }

    scrollY = qint64(vbar->value() - topIndent);

    dirtyScroll = false;
}